

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *this;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  DynamicObject *pDVar8;
  RecyclableObject *this_00;
  uint uVar9;
  int in_stack_00000010;
  Arguments local_60;
  DynamicObject *local_50;
  RecyclableObject *result;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (RecyclableObject *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00cde8f7;
    *puVar6 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&result);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  uVar9 = callInfo_local._0_4_;
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x11,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar4) goto LAB_00cde8f7;
    *puVar6 = 0;
    uVar9 = callInfo_local._0_4_;
  }
  pRVar7 = (RecyclableObject *)
           CallInfo::GetNewTarget(uVar9 >> 0x18,(Var *)&stack0x00000018,uVar9 & 0xffffff);
  local_60.Info = callInfo_local;
  local_60.Values = (Type)&stack0x00000018;
  bVar4 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_60);
  if (pRVar7 != function && bVar4) {
    pRVar7 = VarTo<Js::RecyclableObject>(pRVar7);
    pDVar8 = JavascriptLibrary::CreateObject(this,true,0);
    pRVar7 = JavascriptOperators::OrdinaryCreateFromConstructor
                       (pRVar7,&pDVar8->super_RecyclableObject,(DynamicObject *)0x0,pSVar2);
    return pRVar7;
  }
  if (((ulong)callInfo_local & 0xfffffe) == 0) {
    pRVar7 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
  }
  if (pRVar7 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00cde8f7;
    *puVar6 = 0;
LAB_00cde7d6:
    this_00 = UnsafeVarTo<Js::RecyclableObject>(pRVar7);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00cde8f7;
      *puVar6 = 0;
    }
    TVar1 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this_00), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00cde8f7;
      *puVar6 = 0;
    }
    if ((TVar1 - TypeIds_Function < 0x39) &&
       ((0x10000200000dfc7U >> ((ulong)(TVar1 - TypeIds_Function) & 0x3f) & 1) != 0)) {
      return pRVar7;
    }
    if (TVar1 < TypeIds_Boolean) {
      if (((ulong)result & 0x10000000) != 0) {
        return pRVar7;
      }
      pDVar8 = JavascriptLibrary::CreateObject(this,true,0);
      return pDVar8;
    }
  }
  else if (((ulong)pRVar7 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)pRVar7 & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)pRVar7 >> 0x32 == 0 && ((ulong)pRVar7 & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00cde7d6;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00cde8f7;
    *puVar6 = 0;
  }
  local_50 = (DynamicObject *)0x0;
  JavascriptConversion::ToObject(pRVar7,pSVar2,(RecyclableObject **)&local_50);
  if (local_50 == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x3c,"(result)","result");
    if (!bVar4) {
LAB_00cde8f7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  return local_50;
}

Assistant:

Var JavascriptObject::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    if (JavascriptOperators::GetAndAssertIsConstructorSuperCall(args) &&
        newTarget != function)
    {
        return JavascriptOperators::OrdinaryCreateFromConstructor(
            VarTo<RecyclableObject>(newTarget),
            library->CreateObject(true),
            nullptr,
            scriptContext);
    }

    Var arg = args.Info.Count > 1 ? args[1] : library->GetUndefined();
    switch (JavascriptOperators::GetTypeId(arg))
    {
        case TypeIds_Undefined:
        case TypeIds_Null:
            // Null and undefined result in a new object
            return (callInfo.Flags & CallFlags_NotUsed)
                ? arg
                : library->CreateObject(true);

        case TypeIds_StringObject:
        case TypeIds_Function:
        case TypeIds_Array:
        case TypeIds_ES5Array:
        case TypeIds_RegEx:
        case TypeIds_NumberObject:
        case TypeIds_SIMDObject:
        case TypeIds_Date:
        case TypeIds_BooleanObject:
        case TypeIds_Error:
        case TypeIds_Object:
        case TypeIds_Arguments:
        case TypeIds_ActivationObject:
        case TypeIds_SymbolObject:
            // Since we know this is an object, we can skip ToObject
            return arg;
    }

    RecyclableObject* result = nullptr;
    JavascriptConversion::ToObject(arg, scriptContext, &result);
    Assert(result);
    return result;
}